

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O0

void dg::pta::PointerAnalysisFS::mergeGlobalsState(MemoryMapT *mm,GlobalNodesT *globals)

{
  bool bVar1;
  MemoryMapT *globmm;
  PSNode **glob;
  const_iterator __end2;
  const_iterator __begin2;
  GlobalNodesT *__range2;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (PSNode **)
       std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                 ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                  in_stack_ffffffffffffffc8);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
            ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
             in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
          *)__gnu_cxx::
            __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
            ::operator*(local_20);
    in_stack_ffffffffffffffc8 =
         SubgraphNode<dg::pta::PSNode>::
         getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                   ((SubgraphNode<dg::pta::PSNode> *)
                    ((PSNode *)in_stack_ffffffffffffffd0->_M_current + 8));
    if (in_stack_ffffffffffffffc8 !=
        (map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
         *)0x0) {
      mergeMaps(mm,(MemoryMapT *)globals,(PointsToSetT *)__range2);
    }
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

static void mergeGlobalsState(MemoryMapT *mm,
                                  decltype(PG->getGlobals()) &globals) {
        for (const auto &glob : globals) {
            if (MemoryMapT *globmm = glob->getData<MemoryMapT>()) {
                mergeMaps(mm, globmm, nullptr);
            }
        }
    }